

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_3fPoint * __thiscall ON_3fPoint::operator=(ON_3fPoint *this,float *p)

{
  float fVar1;
  
  if (p == (float *)0x0) {
    this->x = 0.0;
    this->y = 0.0;
    fVar1 = 0.0;
  }
  else {
    this->x = *p;
    this->y = p[1];
    fVar1 = p[2];
  }
  this->z = fVar1;
  return this;
}

Assistant:

ON_3fPoint& ON_3fPoint::operator=(const float* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
    z = p[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}